

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnLocalDecl
          (BinaryReaderIR *this,Index decl_index,Index count,Type type)

{
  bool bVar1;
  Index IVar2;
  Index count_local;
  Index decl_index_local;
  BinaryReaderIR *this_local;
  Type type_local;
  
  LocalTypes::AppendDecl(&this->current_func_->local_types,type,count);
  IVar2 = Func::GetNumLocals(this->current_func_);
  if (IVar2 < 0xc351) {
    bVar1 = wabt::operator==(type,V128);
    (this->module_->features_used).simd = ((this->module_->features_used).simd & 1U) != 0 || bVar1;
    bVar1 = wabt::operator==(type,ExnRef);
    (this->module_->features_used).exceptions =
         ((this->module_->features_used).exceptions & 1U) != 0 || bVar1;
    Result::Result((Result *)&type_local,Ok);
  }
  else {
    PrintError(this,"function local count exceeds maximum value");
    Result::Result((Result *)&type_local,Error);
  }
  return (Result)type_local.enum_;
}

Assistant:

Result BinaryReaderIR::OnLocalDecl(Index decl_index, Index count, Type type) {
  current_func_->local_types.AppendDecl(type, count);

  if (current_func_->GetNumLocals() > kMaxFunctionLocals) {
    PrintError("function local count exceeds maximum value");
    return Result::Error;
  }

  module_->features_used.simd |= (type == Type::V128);
  module_->features_used.exceptions |= (type == Type::ExnRef);
  return Result::Ok;
}